

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_handle::
sync_call<void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
          **a)

{
  bool bVar1;
  element_type *this_00;
  session_impl *this_01;
  io_context *ctx;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  undefined1 local_c0 [8];
  undefined1 local_b8 [56];
  vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_> *local_80;
  exception_ptr local_78;
  exception_ptr ex;
  bool done;
  session_impl *ses;
  error_code_enum local_4c;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_> **a_local;
  offset_in_torrent_to_subr f_local;
  torrent_handle *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RCX;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_48);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (!bVar1) {
    local_4c = invalid_torrent_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_4c);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
  this_01 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ex._M_exception_object._7_1_ = 0;
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_78);
  ctx = libtorrent::aux::session_impl::get_context(this_01);
  local_b8._0_8_ = (long)&ex._M_exception_object + 7;
  local_b8._8_8_ = this_01;
  local_b8._16_8_ = &local_78;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)(local_b8 + 0x18),
             (shared_ptr<libtorrent::aux::torrent> *)local_48);
  local_80 = (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
              *)(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
  local_b8._40_8_ = f;
  local_b8._48_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call<void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*&>(void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*&)const::_lambda()_1_>
            (ctx,(type_conflict4 *)local_b8,(type *)0x0);
  const::{lambda()#1}::~sync_call((_lambda___1_ *)local_b8);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 7),this_01);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_48);
    return;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_c0,&local_78);
  uVar2 = ::std::rethrow_exception((exception_ptr)local_c0);
  const::{lambda()#1}::~sync_call((_lambda___1_ *)local_b8);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_48);
  _Unwind_Resume(uVar2);
}

Assistant:

void torrent_handle::sync_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);
		if (ex) std::rethrow_exception(ex);
	}